

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QList<QTzType> *
parseTzTypes(QList<QTzType> *__return_storage_ptr__,QDataStream *ds,int tzh_typecnt)

{
  Status SVar1;
  pointer pQVar2;
  ulong uVar3;
  ulong size;
  ulong uVar4;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzType>::QList(__return_storage_ptr__,(long)tzh_typecnt);
  uVar3 = 0;
  uVar4 = (ulong)(uint)tzh_typecnt;
  if (tzh_typecnt < 1) {
    uVar4 = uVar3;
  }
  size = 0;
  while( true ) {
    if (uVar4 == size) {
      return __return_storage_ptr__;
    }
    SVar1 = QDataStream::status(ds);
    if (SVar1 != Ok) break;
    pQVar2 = QList<QTzType>::data(__return_storage_ptr__);
    QDataStream::operator>>(ds,(qint32 *)((long)&pQVar2->tz_gmtoff + uVar3));
    SVar1 = QDataStream::status(ds);
    if (SVar1 == Ok) {
      QDataStream::operator>>(ds,&pQVar2->tz_isdst + uVar3);
    }
    SVar1 = QDataStream::status(ds);
    if (SVar1 == Ok) {
      QDataStream::operator>>(ds,(qint8 *)(&pQVar2->tz_abbrind + uVar3));
    }
    SVar1 = QDataStream::status(ds);
    if (SVar1 != Ok) {
      QList<QTzType>::resize(__return_storage_ptr__,size);
    }
    size = size + 1;
    uVar3 = uVar3 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

static QList<QTzType> parseTzTypes(QDataStream &ds, int tzh_typecnt)
{
    QList<QTzType> types(tzh_typecnt);

    // Parse tzh_typecnt x transition types
    for (int i = 0; i < tzh_typecnt && ds.status() == QDataStream::Ok; ++i) {
        QTzType &type = types[i];
        // Parse UTC Offset, 4 bytes
        ds >> type.tz_gmtoff;
        // Parse Is DST flag, 1 byte
        if (ds.status() == QDataStream::Ok)
            ds >> type.tz_isdst;
        // Parse Abbreviation Array Index, 1 byte
        if (ds.status() == QDataStream::Ok)
            ds >> type.tz_abbrind;
        if (ds.status() != QDataStream::Ok)
            types.resize(i);
    }

    return types;
}